

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O2

reference __thiscall
jsoncons::jsonpath::detail::
index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::evaluate(index_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           *this,eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                 *context,reference root,path_node_type *last,reference current,
          result_options options,error_code *ec)

{
  size_t index;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  path_node_type *ppVar4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar5;
  undefined4 extraout_var;
  reference pbVar6;
  size_t i;
  supertype *psVar7;
  _func_int **pp_Var8;
  size_t i_1;
  
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array(current);
  if (bVar1) {
    sVar3 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size(current);
    index = this->index_;
    if ((long)index < (long)sVar3 && -1 < (long)index) {
      ppVar4 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::generate(context,last,index,options);
      pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(current,index);
      psVar7 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar7 == (supertype *)0x0) {
        return pbVar5;
      }
      pp_Var8 = psVar7->_vptr_jsonpath_selector;
    }
    else {
      sVar3 = sVar3 + index;
      if (-1 < (long)index || (long)sVar3 < 0) goto LAB_0031fcc6;
      ppVar4 = path_generator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ::generate(context,last,sVar3,options);
      pbVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at(current,sVar3);
      psVar7 = (this->
               super_base_selector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
               ).tail_;
      if (psVar7 == (supertype *)0x0) {
        return pbVar5;
      }
      pp_Var8 = psVar7->_vptr_jsonpath_selector;
    }
    iVar2 = (*pp_Var8[3])(psVar7,context,root,ppVar4,pbVar5,(ulong)options,ec);
    return (reference)CONCAT44(extraout_var,iVar2);
  }
LAB_0031fcc6:
  pbVar6 = eval_context<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
           ::null_value(context);
  return pbVar6;
}

Assistant:

reference evaluate(eval_context<Json,JsonReference>& context,
                           reference root,
                           const path_node_type& last, 
                           reference current, 
                           result_options options,
                           std::error_code& ec) const override
        {
            if (current.is_array())
            {
                auto slen = static_cast<int64_t>(current.size());
                if (index_ >= 0 && index_ < slen)
                {
                    auto i = static_cast<std::size_t>(index_);
                    return this->evaluate_tail(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), options, ec);
                }
                int64_t index = slen + index_;
                if (index >= 0 && index < slen)
                {
                    auto i = static_cast<std::size_t>(index);
                    return this->evaluate_tail(context, root, 
                                        path_generator_type::generate(context, last, i, options), 
                                        current.at(i), options, ec);
                }
                return context.null_value();
            }
            return context.null_value();
        }